

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_printer.c
# Opt level: O1

int flatcc_json_printer_init_dynamic_buffer(flatcc_json_printer_t *ctx,size_t buffer_size)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  size_t __size;
  
  sVar2 = 0x40;
  if (0x40 < buffer_size) {
    sVar2 = buffer_size;
  }
  __size = 0x1000;
  if (buffer_size != 0) {
    __size = sVar2;
  }
  ctx->fp = (void *)0x0;
  ctx->flush = (flatcc_json_printer_flush_f *)0x0;
  ctx->own_buffer = '\0';
  ctx->indent = '\0';
  ctx->unquote = '\0';
  ctx->noenum = '\0';
  ctx->skip_default = '\0';
  ctx->force_default = '\0';
  *(undefined2 *)&ctx->field_0x36 = 0;
  ctx->level = 0;
  ctx->error = 0;
  ctx->pflush = (char *)0x0;
  ctx->p = (char *)0x0;
  ctx->flush_size = 0;
  ctx->total = 0;
  ctx->buf = (char *)0x0;
  ctx->size = 0;
  pcVar3 = (char *)malloc(__size);
  ctx->buf = pcVar3;
  ctx->own_buffer = '\x01';
  ctx->size = __size;
  ctx->flush_size = __size - 0x40;
  ctx->p = pcVar3;
  ctx->pflush = pcVar3 + (__size - 0x40);
  ctx->flush = __flatcc_json_printer_flush_dynamic_buffer;
  iVar1 = 0;
  if ((pcVar3 == (char *)0x0) && (iVar1 = -1, ctx->error == 0)) {
    ctx->error = 3;
  }
  return iVar1;
}

Assistant:

int flatcc_json_printer_init_dynamic_buffer(flatcc_json_printer_t *ctx, size_t buffer_size)
{
    if (buffer_size == 0) {
        buffer_size = FLATCC_JSON_PRINT_DYN_BUFFER_SIZE;
    }
    if (buffer_size < FLATCC_JSON_PRINT_RESERVE) {
        buffer_size = FLATCC_JSON_PRINT_RESERVE;
    }
    memset(ctx, 0, sizeof(*ctx));
    ctx->buf = FLATCC_JSON_PRINTER_ALLOC(buffer_size);
    ctx->own_buffer = 1;
    ctx->size = buffer_size;
    ctx->flush_size = ctx->size - FLATCC_JSON_PRINT_RESERVE;
    ctx->p = ctx->buf;
    ctx->pflush = ctx->buf + ctx->flush_size;
    ctx->flush = __flatcc_json_printer_flush_dynamic_buffer;
    if (!ctx->buf) {
        RAISE_ERROR(overflow);
        return -1;
    }
    return 0;
}